

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalTree.h
# Opt level: O3

void __thiscall
IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>::findContained
          (IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long> *this,unsigned_long start,
          unsigned_long stop,intervalVector *contained)

{
  IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long> *this_00;
  pointer pIVar1;
  ulong uVar2;
  const_iterator i;
  pointer __x;
  
  do {
    __x = (this->intervals).
          super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
    pIVar1 = *(pointer *)
              ((long)&(this->intervals).
                      super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data + 8);
    if ((__x != pIVar1) && (__x->start <= stop)) {
      do {
        if ((start <= __x->start) && (__x->stop <= stop)) {
          std::
          vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
          ::push_back(contained,__x);
          pIVar1 = *(pointer *)
                    ((long)&(this->intervals).
                            super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
                            ._M_impl.super__Vector_impl_data + 8);
        }
        __x = __x + 1;
      } while (__x != pIVar1);
    }
    this_00 = (this->left)._M_t.
              super___uniq_ptr_impl<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_*,_std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
              .
              super__Head_base<0UL,_IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_*,_false>
              ._M_head_impl;
    uVar2 = this->center;
    if (start <= uVar2 &&
        this_00 != (IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long> *)0x0) {
      findContained(this_00,start,stop,contained);
      uVar2 = this->center;
    }
    this = (this->right)._M_t.
           super___uniq_ptr_impl<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_*,_std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
           .
           super__Head_base<0UL,_IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_*,_false>
           ._M_head_impl;
  } while ((this != (IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long> *)0x0) &&
          (uVar2 <= stop));
  return;
}

Assistant:

void findContained(K start, K stop, intervalVector& contained) const {
        if (!intervals.empty() && ! (stop < intervals.front().start)) {
            for (typename intervalVector::const_iterator i = intervals.begin(); i != intervals.end(); ++i) {
                const interval& interval = *i;
                if (interval.start >= start && interval.stop <= stop) {
                    contained.push_back(interval);
                }
            }
        }

        if (left && start <= center) {
            left->findContained(start, stop, contained);
        }

        if (right && stop >= center) {
            right->findContained(start, stop, contained);
        }

    }